

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

double ecs_time_measure(ecs_time_t *start)

{
  ecs_time_t eVar1;
  uint uVar2;
  ecs_time_t in_RAX;
  uint32_t uVar3;
  ecs_time_t local_18;
  
  local_18 = in_RAX;
  (*ecs_os_api.get_time_)(&local_18);
  eVar1 = *start;
  uVar3 = local_18.nanosec + 1000000000;
  uVar2 = ~eVar1.sec;
  if ((ulong)eVar1 >> 0x20 <= (ulong)local_18 >> 0x20) {
    uVar3 = local_18.nanosec;
    uVar2 = -eVar1.sec;
  }
  *start = local_18;
  return (double)(uVar3 - eVar1.nanosec) / 1000000000.0 + (double)(uVar2 + local_18.sec);
}

Assistant:

double ecs_time_measure(
    ecs_time_t *start)
{
    ecs_time_t stop, temp;
    ecs_os_get_time(&stop);
    temp = stop;
    stop = ecs_time_sub(stop, *start);
    *start = temp;
    return ecs_time_to_double(stop);
}